

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtcc_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  code *pcVar4;
  char *a;
  _func_int_int *func;
  int i;
  TCCState *s;
  char **argv_local;
  int argc_local;
  
  lVar3 = tcc_new();
  if (lVar3 != 0) {
    for (func._4_4_ = 1; func._4_4_ < argc; func._4_4_ = func._4_4_ + 1) {
      pcVar1 = argv[func._4_4_];
      if (*pcVar1 == '-') {
        if (pcVar1[1] == 'B') {
          tcc_set_lib_path(lVar3,pcVar1 + 2);
        }
        else if (pcVar1[1] == 'I') {
          tcc_add_include_path(lVar3,pcVar1 + 2);
        }
        else if (pcVar1[1] == 'L') {
          tcc_add_library_path(lVar3,pcVar1 + 2);
        }
      }
    }
    tcc_set_output_type(lVar3,1);
    iVar2 = tcc_compile_string(lVar3,my_program);
    if (iVar2 == -1) {
      argv_local._4_4_ = 1;
    }
    else {
      tcc_add_symbol(lVar3,"add",add);
      tcc_add_symbol(lVar3,"hello","Hello World!");
      iVar2 = tcc_relocate(lVar3,1);
      if (iVar2 < 0) {
        argv_local._4_4_ = 1;
      }
      else {
        pcVar4 = (code *)tcc_get_symbol(lVar3,"foo");
        if (pcVar4 == (code *)0x0) {
          argv_local._4_4_ = 1;
        }
        else {
          (*pcVar4)(0x20);
          tcc_delete(lVar3);
          argv_local._4_4_ = 0;
        }
      }
    }
    return argv_local._4_4_;
  }
  fprintf(_stderr,"Could not create tcc state\n");
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
  TCCState* s;
  int i;
  int (*func)(int);

  s = tcc_new();
  if (!s) {
    fprintf(stderr, "Could not create tcc state\n");
    exit(1);
  }

  /* if tcclib.h and libtcc1.a are not installed, where can we find them */
  for (i = 1; i < argc; ++i) {
    char* a = argv[i];
    if (a[0] == '-') {
      if (a[1] == 'B')
        tcc_set_lib_path(s, a + 2);
      else if (a[1] == 'I')
        tcc_add_include_path(s, a + 2);
      else if (a[1] == 'L')
        tcc_add_library_path(s, a + 2);
    }
  }

  /* MUST BE CALLED before any compilation */
  tcc_set_output_type(s, TCC_OUTPUT_MEMORY);

  if (tcc_compile_string(s, my_program) == -1)
    return 1;

  /* as a test, we add symbols that the compiled program can use.
     You may also open a dll with tcc_add_dll() and use symbols from that */
  tcc_add_symbol(s, "add", add);
  tcc_add_symbol(s, "hello", hello);

  /* relocate the code */
  if (tcc_relocate(s, TCC_RELOCATE_AUTO) < 0)
    return 1;

  /* get entry symbol */
  func = tcc_get_symbol(s, "foo");
  if (!func)
    return 1;

  /* run the code */
  func(32);

  /* delete the state */
  tcc_delete(s);

  return 0;
}